

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayFill
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayFill *curr)

{
  Literal *pLVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  shared_ptr<wasm::GCData> sVar5;
  undefined1 local_1d0 [8];
  Flow ref;
  Flow index;
  Flow value;
  Flow size;
  undefined1 auStack_a8 [8];
  Field field;
  Literal local_90;
  undefined1 local_78 [8];
  Literal fillVal;
  undefined1 local_48 [8];
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_1d0,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,curr->index);
    if (index.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)&index.breakTo.super_IString.str._M_str,this,curr->value);
      if (value.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)&value.breakTo.super_IString.str._M_str,this,curr->size);
        if (size.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)local_1d0);
          sVar5 = Literal::getGCData((Literal *)local_48);
          if (local_48 == (undefined1  [8])0x0) {
            (*this->_vptr_ExpressionRunner[2])
                      (this,"null ref",
                       sVar5.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
          }
          pLVar1 = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
          data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Literal::getUnsigned(pLVar1);
          pLVar1 = Flow::getSingleValue((Flow *)&index.breakTo.super_IString.str._M_str);
          Literal::Literal((Literal *)local_78,pLVar1);
          pLVar1 = Flow::getSingleValue((Flow *)&value.breakTo.super_IString.str._M_str);
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Literal::getUnsigned(pLVar1);
          wasm::Type::getHeapType(&curr->ref->type);
          HeapType::getArray((HeapType *)&fillVal.type);
          auStack_a8 = (undefined1  [8])fillVal.type.id;
          Literal::Literal(&local_90,(Literal *)local_78);
          truncateForPacking((Literal *)&fillVal.type,this,&local_90,(Field *)auStack_a8);
          Literal::operator=((Literal *)local_78,(Literal *)&fillVal.type);
          Literal::~Literal((Literal *)&fillVal.type);
          Literal::~Literal(&local_90);
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (((long)(((Literals *)((long)local_48 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(((Literals *)((long)local_48 + 8))->super_SmallVector<wasm::Literal,_1UL>
                          ).flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18 +
                   (((Literals *)((long)local_48 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                   usedFixed);
          if (((p_Var3 < p_Var2 ||
                p_Var3 < data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi) ||
              (CARRY8((ulong)p_Var2,
                      (ulong)data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi))) ||
             (p_Var3 < (long)&p_Var2->_vptr__Sp_counted_base +
                       data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds array access in array.fill");
          }
          lVar4 = (long)data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi * 0x18 + -0x18;
          for (p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)-(long)p_Var3 != p_Var2;
              p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&p_Var3[-1]._M_weak_count + 3)) {
            pLVar1 = (((Literals *)((long)local_48 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     fixed._M_elems;
            if (data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != p_Var3) {
              pLVar1 = (Literal *)
                       ((long)&((((Literals *)((long)local_48 + 8))->
                                super_SmallVector<wasm::Literal,_1UL>).flexible.
                                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar4);
            }
            Literal::operator=(pLVar1,(Literal *)local_78);
            lVar4 = lVar4 + 0x18;
          }
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
          Literal::~Literal((Literal *)local_78);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
        }
        else {
          Flow::Flow(__return_storage_ptr__,(Flow *)&value.breakTo.super_IString.str._M_str);
        }
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&value.breakTo.super_IString.str._M_str);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&index.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&index.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_1d0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_1d0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayFill(ArrayFill* curr) {
    NOTE_ENTER("ArrayFill");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    size_t indexVal = index.getSingleValue().getUnsigned();
    Literal fillVal = value.getSingleValue();
    size_t sizeVal = size.getSingleValue().getUnsigned();

    auto field = curr->ref->type.getHeapType().getArray().element;
    fillVal = truncateForPacking(fillVal, field);

    size_t arraySize = data->values.size();
    if (indexVal > arraySize || sizeVal > arraySize ||
        indexVal + sizeVal > arraySize || indexVal + sizeVal < indexVal) {
      trap("out of bounds array access in array.fill");
    }
    for (size_t i = 0; i < sizeVal; ++i) {
      data->values[indexVal + i] = fillVal;
    }
    return {};
  }